

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upsampling.c
# Opt level: O3

void WebPInitYUV444Converters(void)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)
                             &WebPInitYUV444Converters::WebPInitYUV444Converters_body_lock);
  if (iVar1 != 0) {
    return;
  }
  if (WebPInitYUV444Converters::WebPInitYUV444Converters_body_last_cpuinfo_used != VP8GetCPUInfo) {
    WebPYUV444Converters[1] = WebPYuv444ToRgba_C;
    WebPYUV444Converters[3] = WebPYuv444ToBgra_C;
    WebPYUV444Converters[0] = WebPYuv444ToRgb_C;
    WebPYUV444Converters[2] = WebPYuv444ToBgr_C;
    WebPYUV444Converters[4] = WebPYuv444ToArgb_C;
    WebPYUV444Converters[5] = WebPYuv444ToRgba4444_C;
    WebPYUV444Converters[6] = WebPYuv444ToRgb565_C;
    WebPYUV444Converters[7] = WebPYuv444ToRgba_C;
    WebPYUV444Converters[8] = WebPYuv444ToBgra_C;
    WebPYUV444Converters[9] = WebPYuv444ToArgb_C;
    WebPYUV444Converters[10] = WebPYuv444ToRgba4444_C;
    if (VP8GetCPUInfo != (VP8CPUInfo)0x0) {
      iVar1 = (*VP8GetCPUInfo)(kSSE2);
      if (iVar1 != 0) {
        WebPInitYUV444ConvertersSSE2();
      }
      iVar1 = (*VP8GetCPUInfo)(kSSE4_1);
      if (iVar1 != 0) {
        WebPInitYUV444ConvertersSSE41();
      }
    }
  }
  WebPInitYUV444Converters::WebPInitYUV444Converters_body_last_cpuinfo_used = VP8GetCPUInfo;
  pthread_mutex_unlock
            ((pthread_mutex_t *)&WebPInitYUV444Converters::WebPInitYUV444Converters_body_lock);
  return;
}

Assistant:

WEBP_DSP_INIT_FUNC(WebPInitYUV444Converters) {
  WebPYUV444Converters[MODE_RGBA]      = WebPYuv444ToRgba_C;
  WebPYUV444Converters[MODE_BGRA]      = WebPYuv444ToBgra_C;
  WebPYUV444Converters[MODE_RGB]       = WebPYuv444ToRgb_C;
  WebPYUV444Converters[MODE_BGR]       = WebPYuv444ToBgr_C;
  WebPYUV444Converters[MODE_ARGB]      = WebPYuv444ToArgb_C;
  WebPYUV444Converters[MODE_RGBA_4444] = WebPYuv444ToRgba4444_C;
  WebPYUV444Converters[MODE_RGB_565]   = WebPYuv444ToRgb565_C;
  WebPYUV444Converters[MODE_rgbA]      = WebPYuv444ToRgba_C;
  WebPYUV444Converters[MODE_bgrA]      = WebPYuv444ToBgra_C;
  WebPYUV444Converters[MODE_Argb]      = WebPYuv444ToArgb_C;
  WebPYUV444Converters[MODE_rgbA_4444] = WebPYuv444ToRgba4444_C;

  if (VP8GetCPUInfo != NULL) {
#if defined(WEBP_HAVE_SSE2)
    if (VP8GetCPUInfo(kSSE2)) {
      WebPInitYUV444ConvertersSSE2();
    }
#endif
#if defined(WEBP_HAVE_SSE41)
    if (VP8GetCPUInfo(kSSE4_1)) {
      WebPInitYUV444ConvertersSSE41();
    }
#endif
#if defined(WEBP_USE_MIPS_DSP_R2)
    if (VP8GetCPUInfo(kMIPSdspR2)) {
      WebPInitYUV444ConvertersMIPSdspR2();
    }
#endif
  }
}